

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O1

void Kit_PlaToIsop(char *pSop,Vec_Int_t *vCover)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  
  for (lVar5 = 0; pSop[lVar5] != '\0'; lVar5 = lVar5 + 1) {
    if (pSop[lVar5] == '\n') {
      uVar4 = (int)lVar5 - 2;
      goto LAB_005d7a60;
    }
  }
  uVar4 = 0xffffffff;
LAB_005d7a60:
  if ((int)uVar4 < 1) {
    __assert_fail("nVars > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                  ,0x11f,"void Kit_PlaToIsop(char *, Vec_Int_t *)");
  }
  vCover->nSize = 0;
  if (*pSop != '\0') {
    do {
      iVar8 = 0;
      lVar5 = (ulong)uVar4 + 1;
      do {
        cVar2 = pSop[lVar5 + -2];
        if (cVar2 == '-') {
          iVar8 = iVar8 << 2;
        }
        else if (cVar2 == '1') {
          iVar8 = iVar8 * 4 + 2;
        }
        else {
          if (cVar2 != '0') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                          ,0x12d,"void Kit_PlaToIsop(char *, Vec_Int_t *)");
          }
          iVar8 = iVar8 * 4 + 1;
        }
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
      uVar3 = vCover->nCap;
      if (vCover->nSize == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (vCover->pArray == (int *)0x0) {
            piVar6 = (int *)malloc(0x40);
          }
          else {
            piVar6 = (int *)realloc(vCover->pArray,0x40);
          }
          vCover->pArray = piVar6;
          iVar7 = 0x10;
        }
        else {
          iVar7 = uVar3 * 2;
          if (iVar7 <= (int)uVar3) goto LAB_005d7b2c;
          if (vCover->pArray == (int *)0x0) {
            piVar6 = (int *)malloc((ulong)uVar3 << 3);
          }
          else {
            piVar6 = (int *)realloc(vCover->pArray,(ulong)uVar3 << 3);
          }
          vCover->pArray = piVar6;
        }
        if (piVar6 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        vCover->nCap = iVar7;
      }
LAB_005d7b2c:
      iVar7 = vCover->nSize;
      vCover->nSize = iVar7 + 1;
      vCover->pArray[iVar7] = iVar8;
      pcVar1 = pSop + (uVar4 + 3);
      pSop = pSop + (uVar4 + 3);
    } while (*pcVar1 != '\0');
  }
  return;
}

Assistant:

void Kit_PlaToIsop( char * pSop, Vec_Int_t * vCover )
{
    char * pCube;
    int k, nVars, Entry;
    nVars = Kit_PlaGetVarNum( pSop );
    assert( nVars > 0 );
    // create cubes
    Vec_IntClear( vCover );
    for ( pCube = pSop; *pCube; pCube += nVars + 3 )
    {
        Entry = 0;
        for ( k = nVars - 1; k >= 0; k-- )
            if ( pCube[k] == '0' )
                Entry = (Entry << 2) | 1;
            else if ( pCube[k] == '1' )
                Entry = (Entry << 2) | 2;
            else if ( pCube[k] == '-' )
                Entry = (Entry << 2);
            else 
                assert( 0 );
        Vec_IntPush( vCover, Entry );
    }
}